

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *pNtk,int nLutSize,int Id,int *pCounter)

{
  int iVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  Kit_DsdObj_t KVar4;
  uint uVar5;
  ulong uVar6;
  
  pKVar3 = Kit_DsdNtkObj(pNtk,Id);
  iVar1 = 0;
  if (pKVar3 != (Kit_DsdObj_t *)0x0) {
    KVar4 = *pKVar3;
    uVar5 = (uint)KVar4 >> 6 & 7;
    if (uVar5 - 3 < 2) {
      if (((uint)KVar4 & 0xfc000000) != 0x8000000) {
        __assert_fail("pObj->nFans == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0x481,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
      }
      iVar1 = Abc_Lit2Var((uint)*(ushort *)(pKVar3 + 1));
      iVar1 = Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar1,pCounter);
      iVar2 = Abc_Lit2Var((uint)*(ushort *)&pKVar3[1].field_0x2);
      iVar2 = Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar2,pCounter);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        iVar1 = iVar2 + -1;
      }
      else if ((iVar1 == 0) || (iVar2 != 0)) {
        *pCounter = *pCounter + 1;
        iVar1 = nLutSize + -2;
      }
      else {
        iVar1 = iVar1 + -1;
      }
    }
    else {
      if (uVar5 != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0x48b,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
      }
      if (nLutSize < (int)((uint)KVar4 >> 0x1a)) {
        *pCounter = 1000;
        iVar1 = 0;
      }
      else {
        for (uVar6 = 0; uVar6 < (uint)KVar4 >> 0x1a; uVar6 = uVar6 + 1) {
          iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar3[1].field_0x0 + uVar6 * 2));
          Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar1,pCounter);
          KVar4 = *pKVar3;
        }
        *pCounter = *pCounter + 1;
        iVar1 = nLutSize - ((uint)*pKVar3 >> 0x1a);
      }
    }
  }
  return iVar1;
}

Assistant:

int Kit_DsdCountLuts_rec( Kit_DsdNtk_t * pNtk, int nLutSize, int Id, int * pCounter )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, Res0, Res1;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        assert( pObj->nFans == 2 );
        Res0 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[0]), pCounter );
        Res1 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[1]), pCounter );
        if ( Res0 == 0 && Res1 > 0 )
            return Res1 - 1;
        if ( Res0 > 0 && Res1 == 0 )
            return Res0 - 1;
        (*pCounter)++;
        return nLutSize - 2;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    if ( (int)pObj->nFans > nLutSize ) //+ 1 )
    {
        *pCounter = 1000;
        return 0;
    }
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(iLit), pCounter );
    (*pCounter)++;
//    if ( (int)pObj->nFans == nLutSize + 1 )
//        (*pCounter)++;
    return nLutSize - pObj->nFans;
}